

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O1

void AliasChecker::gatherAdditiveBase
               (Varnode *startvn,
               vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *addbase)

{
  pointer *ppAVar1;
  int iVar2;
  Varnode *pVVar3;
  _List_node_base *p_Var4;
  iterator __position;
  AddBase *pAVar5;
  ulong uVar6;
  Varnode *pVVar7;
  Varnode *pVVar8;
  ulong uVar9;
  bool bVar10;
  _List_node_base *p_Var11;
  vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> vnqueue;
  AddBase local_68;
  vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> local_58;
  vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *local_38;
  
  local_58.super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>._M_impl
  .super__Vector_impl_data._M_start = (AddBase *)0x0;
  local_58.super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>._M_impl
  .super__Vector_impl_data._M_finish = (AddBase *)0x0;
  local_58.super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (AddBase *)0x0;
  *(byte *)&startvn->flags = (byte)startvn->flags | 1;
  local_68.index = (Varnode *)0x0;
  local_68.base = startvn;
  std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
  _M_realloc_insert<AliasChecker::AddBase>(&local_58,(iterator)0x0,&local_68);
  if (local_58.super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    pAVar5 = local_58.
             super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    uVar9 = 0;
    local_38 = addbase;
    do {
      pVVar3 = local_58.
               super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar9].base;
      pVVar8 = local_58.
               super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar9].index;
      bVar10 = false;
      for (p_Var11 = (pVVar3->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next;
          p_Var11 != (_List_node_base *)&pVVar3->descend; p_Var11 = p_Var11->_M_next) {
        p_Var4 = p_Var11[1]._M_next;
        iVar2 = *(int *)((long)p_Var4->_M_next + 0x10);
        if (iVar2 < 0x41) {
          if (iVar2 == 1) {
            pVVar7 = *(Varnode **)((long)(p_Var4 + 4) + 8);
            if ((pVVar7->flags & 1) == 0) {
              pVVar7->flags = pVVar7->flags | 1;
              local_68.base = pVVar7;
              if (local_58.
                  super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_58.
                  super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_68.index = pVVar8;
                std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
                _M_realloc_insert<AliasChecker::AddBase>
                          (&local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
              }
              else {
                (local_58.
                 super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->base = pVVar7;
                (local_58.
                 super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->index = pVVar8;
                local_58.
                super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_58.
                     super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                local_68.index = pVVar8;
              }
            }
          }
          else {
            if (iVar2 == 0x13) {
LAB_0027d76d:
              pVVar7 = *(Varnode **)((long)p_Var4[5]._M_next + 8);
              if (pVVar7 == pVVar3) {
                pVVar7 = *(Varnode **)p_Var4[5]._M_next;
              }
              if ((pVVar7->flags & 2) == 0) {
                pVVar8 = pVVar7;
              }
              goto LAB_0027d784;
            }
            if ((iVar2 == 0x14) &&
               (pVVar7 = *(Varnode **)((long)p_Var4[5]._M_next + 8), pVVar3 != pVVar7)) {
              if ((pVVar7->flags & 2) == 0) {
                pVVar8 = pVVar7;
              }
              pVVar7 = *(Varnode **)((long)(p_Var4 + 4) + 8);
              if ((pVVar7->flags & 1) == 0) {
                pVVar7->flags = pVVar7->flags | 1;
                local_68.base = pVVar7;
                if (local_58.
                    super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_58.
                    super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0027d7a9;
                local_68.index = pVVar8;
                std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
                _M_realloc_insert<AliasChecker::AddBase>
                          (&local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
              }
              goto LAB_0027d80b;
            }
          }
LAB_0027d808:
          bVar10 = true;
        }
        else {
          if (1 < iVar2 - 0x42U) {
            if (iVar2 == 0x41) goto LAB_0027d76d;
            goto LAB_0027d808;
          }
LAB_0027d784:
          pVVar7 = *(Varnode **)((long)(p_Var4 + 4) + 8);
          if ((pVVar7->flags & 1) == 0) {
            pVVar7->flags = pVVar7->flags | 1;
            local_68.base = pVVar7;
            if (local_58.
                super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_58.
                super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_68.index = pVVar8;
              std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
              _M_realloc_insert<AliasChecker::AddBase>
                        (&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_68);
            }
            else {
LAB_0027d7a9:
              (local_58.
               super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
               _M_impl.super__Vector_impl_data._M_finish)->base = local_68.base;
              (local_58.
               super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
               _M_impl.super__Vector_impl_data._M_finish)->index = pVVar8;
              local_58.
              super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_58.
                   super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              local_68.index = pVVar8;
            }
          }
        }
LAB_0027d80b:
      }
      if (bVar10) {
        __position._M_current =
             (local_38->
             super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        local_68.base = pVVar3;
        if (__position._M_current ==
            (local_38->
            super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_68.index = pVVar8;
          std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
          _M_realloc_insert<AliasChecker::AddBase>(local_38,__position,&local_68);
        }
        else {
          (__position._M_current)->base = pVVar3;
          (__position._M_current)->index = pVVar8;
          ppAVar1 = &(local_38->
                     super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
          local_68.index = pVVar8;
        }
      }
      uVar9 = uVar9 + 1;
      uVar6 = (long)local_58.
                    super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.
                    super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pAVar5 = local_58.
               super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < uVar6);
  }
  for (; uVar6 != 0; uVar6 = uVar6 - 1) {
    pAVar5->base->flags = pAVar5->base->flags & 0xfffffffe;
    pAVar5 = pAVar5 + 1;
  }
  if (local_58.super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>.
      _M_impl.super__Vector_impl_data._M_start != (AddBase *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AliasChecker::gatherAdditiveBase(Varnode *startvn,vector<AddBase> &addbase)

{
  vector<AddBase> vnqueue;		// varnodes involved in addition with original vn
  Varnode *vn,*subvn,*indexvn,*othervn;
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *op;
  bool nonadduse;
  int4 i=0;

  vn = startvn;
  vn->setMark();
  vnqueue.push_back(AddBase(vn,(Varnode *)0));
  while(i<vnqueue.size()) {
    vn = vnqueue[i].base;
    indexvn = vnqueue[i++].index;
    nonadduse = false;
    for(iter=vn->beginDescend();iter!=vn->endDescend();++iter) {
      op = *iter;
      switch(op->code()) {
      case CPUI_COPY:
	nonadduse = true;	// Treat COPY as both non-add use and part of ADD expression
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      case CPUI_INT_SUB:
	if (vn == op->getIn(1)) {	// Subtracting the pointer
	  nonadduse = true;
	  break;
	}
	othervn = op->getIn(1);
	if (!othervn->isConstant())
	  indexvn = othervn;
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      case CPUI_INT_ADD:
      case CPUI_PTRADD:
	othervn = op->getIn(1);	// Check if something else is being added in besides a constant
	if (othervn == vn)
	  othervn = op->getIn(0);
	if (!othervn->isConstant())
	  indexvn = othervn;
	// fallthru
      case CPUI_PTRSUB:
      case CPUI_SEGMENTOP:
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      default:
	nonadduse = true;	// Used in non-additive expression
      }
    }
    if (nonadduse)
      addbase.push_back(AddBase(vn,indexvn));
  }
  for(i=0;i<vnqueue.size();++i)
    vnqueue[i].base->clearMark();
}